

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O3

_Bool is_valid_row(menu_conflict *menu,int cursor)

{
  int *piVar1;
  _func_int_menu_ptr_int *p_Var2;
  int iVar3;
  int *piVar4;
  
  if (-1 < cursor) {
    piVar1 = menu->filter_list;
    piVar4 = &menu->filter_count;
    if (piVar1 == (int *)0x0) {
      piVar4 = &menu->count;
    }
    if (cursor < *piVar4) {
      if (piVar1 != (int *)0x0) {
        cursor = piVar1[(uint)cursor];
      }
      p_Var2 = menu->row_funcs->valid_row;
      if (p_Var2 != (_func_int_menu_ptr_int *)0x0) {
        iVar3 = (*p_Var2)(menu,cursor);
        return iVar3 != 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool is_valid_row(struct menu *menu, int cursor)
{
	int oid;
	int count = menu->filter_list ? menu->filter_count : menu->count;

	if (cursor < 0 || cursor >= count)
		return false;

	oid = menu->filter_list ? menu->filter_list[cursor] : cursor;

	if (menu->row_funcs->valid_row)
		return menu->row_funcs->valid_row(menu, oid);

	return true;
}